

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch2DocsSamples.cpp
# Opt level: O0

string * __thiscall Greeting::getNationality_abi_cxx11_(Greeting *this)

{
  int *in_RSI;
  string *in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_11 [17];
  
  iVar1 = *in_RSI;
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (allocator<char> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    std::allocator<char>::~allocator(local_11);
  }
  else if (iVar1 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (allocator<char> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdb);
  }
  else if (iVar1 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (allocator<char> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffda);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (allocator<char> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd9);
  }
  return in_RDI;
}

Assistant:

std::string getNationality() const
    {
        switch (nationality)
        {
        case British:
            return "British";
        case American:
            return "American";
        case French:
            return "French";
        default:
            return "Unknown";
        }
    }